

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

uint64_t roaring64_bitmap_get_cardinality(roaring64_bitmap_t *r)

{
  int iVar1;
  leaf_t *leaf;
  uint64_t cardinality;
  art_iterator_t it;
  container_t *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  uint64_t uVar2;
  art_t *in_stack_ffffffffffffff70;
  undefined8 local_88;
  
  art_init_iterator(in_stack_ffffffffffffff70,SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
  uVar2 = 0;
  while (local_88 != 0) {
    iVar1 = container_get_cardinality(in_stack_ffffffffffffff58,'\0');
    uVar2 = (long)iVar1 + uVar2;
    art_iterator_next((art_iterator_t *)0x10e06e);
  }
  return uVar2;
}

Assistant:

uint64_t roaring64_bitmap_get_cardinality(const roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t cardinality = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        cardinality +=
            container_get_cardinality(leaf->container, leaf->typecode);
        art_iterator_next(&it);
    }
    return cardinality;
}